

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variant.cc
# Opt level: O0

void __thiscall variant_visit_A_Test::TestBody(variant_visit_A_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_50;
  Message local_48;
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B> local_18;
  Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B> v;
  variant_visit_A_Test *this_local;
  
  local_18.storage_ = (storage_type)0x0;
  local_18.index_ = '\0';
  local_18._5_3_ = 0;
  v = (Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B>)this;
  state_machine::variant::Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B>::Variant
            (&local_18);
  state_machine::variant::Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B>::
  emplace<(anonymous_namespace)::A,_const_int_&,_0>(&local_18,&TestBody::expected);
  local_3c = state_machine::variant::Variant<(anonymous_namespace)::A,(anonymous_namespace)::B>::
             visit<variant_visit_A_Test::TestBody()::__0>
                       ((Variant<(anonymous_namespace)::A,(anonymous_namespace)::B> *)&local_18);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_38,"v.visit([](auto& a) { return a.value; })","expected",&local_3c,
             &TestBody::expected);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_variant.cc"
               ,0xc1,message);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  state_machine::variant::Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B>::~Variant
            (&local_18);
  return;
}

Assistant:

TEST(variant, visit_A) {
    static constexpr int expected = 42;
    Variant<A, B> v{};

    v.emplace<A>(expected);

    EXPECT_EQ(v.visit([](auto& a) { return a.value; }), expected);
}